

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O2

void __thiscall NaVector::write_file(NaVector *this,NaDataFile *pDF)

{
  uint uVar1;
  undefined4 *puVar2;
  uint uVar3;
  
  if (pDF != (NaDataFile *)0x0) {
    uVar3 = 0;
    while( true ) {
      uVar1 = (*this->_vptr_NaVector[6])(this);
      if (uVar1 <= uVar3) break;
      (*pDF->_vptr_NaDataFile[6])(pDF);
      (*this->_vptr_NaVector[9])(this,(ulong)uVar3);
      (*pDF->_vptr_NaDataFile[2])(pDF,0);
      uVar3 = uVar3 + 1;
    }
    return;
  }
  puVar2 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar2 = 0;
  __cxa_throw(puVar2,&NaException::typeinfo,0);
}

Assistant:

void
NaVector::write_file (NaDataFile* pDF) const
{
    if(NULL == pDF)
        throw(na_null_pointer);

    unsigned    i;
    for(i = 0; i < dim(); ++i){
        pDF->AppendRecord();
        pDF->SetValue(get(i));
    }
}